

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testRgba.cpp
# Opt level: O0

void testRgba(string *tempDir)

{
  byte bVar1;
  ostream *poVar2;
  void *this;
  exception *e;
  int comp;
  int lorder;
  int n;
  int maxThreads;
  Array2D<Imf_2_5::Rgba> p1;
  LineOrder in_stack_000000f8;
  int H;
  int W;
  int in_stack_00000108;
  int in_stack_0000010c;
  Compression in_stack_00000120;
  string *in_stack_000001a0;
  string *in_stack_000006f0;
  Array2D<Imf_2_5::Rgba> *in_stack_fffffffffffffef0;
  int in_stack_fffffffffffffef8;
  int in_stack_fffffffffffffefc;
  Array2D<Imf_2_5::Rgba> *in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff10;
  int in_stack_ffffffffffffff14;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff18;
  long in_stack_ffffffffffffff30;
  long in_stack_ffffffffffffff38;
  Array2D<Imf_2_5::Rgba> *in_stack_ffffffffffffff40;
  string local_a8 [32];
  string local_88 [32];
  string local_68 [32];
  int local_48;
  int local_44;
  int local_40;
  int local_3c;
  undefined4 local_1c;
  undefined4 local_18;
  
  poVar2 = std::operator<<((ostream *)&std::cout,"Testing the RGBA image interface");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  anon_unknown.dwarf_1c4133::rgbaMethods();
  local_18 = 0xed;
  local_1c = 0x77;
  Imf_2_5::Array2D<Imf_2_5::Rgba>::Array2D
            (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
  anon_unknown.dwarf_1c4133::fillPixels
            (in_stack_ffffffffffffff00,in_stack_fffffffffffffefc,in_stack_fffffffffffffef8);
  bVar1 = IlmThread_2_5::supportsThreads();
  local_3c = 0;
  if ((bVar1 & 1) != 0) {
    local_3c = 3;
  }
  for (local_40 = 0; local_40 <= local_3c; local_40 = local_40 + 1) {
    bVar1 = IlmThread_2_5::supportsThreads();
    if ((bVar1 & 1) != 0) {
      Imf_2_5::setGlobalThreadCount(0);
      in_stack_ffffffffffffff18 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::operator<<((ostream *)&std::cout,"\nnumber of threads: ");
      in_stack_ffffffffffffff14 = Imf_2_5::globalThreadCount();
      this = (void *)std::ostream::operator<<(in_stack_ffffffffffffff18,in_stack_ffffffffffffff14);
      std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
    }
    for (local_44 = 0; local_44 < 2; local_44 = local_44 + 1) {
      for (local_48 = 0; local_48 < 10; local_48 = local_48 + 1) {
        std::operator+(in_stack_ffffffffffffff18,
                       (char *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
        std::__cxx11::string::c_str();
        anon_unknown.dwarf_1c4133::writeReadRGBA
                  ((char *)tempDir,in_stack_0000010c,in_stack_00000108,_W,H,in_stack_000000f8,
                   in_stack_00000120);
        std::__cxx11::string::~string(local_68);
        std::operator+(in_stack_ffffffffffffff18,
                       (char *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
        std::__cxx11::string::c_str();
        anon_unknown.dwarf_1c4133::writeReadRGBA
                  ((char *)tempDir,in_stack_0000010c,in_stack_00000108,_W,H,in_stack_000000f8,
                   in_stack_00000120);
        std::__cxx11::string::~string(local_88);
        std::operator+(in_stack_ffffffffffffff18,
                       (char *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
        std::__cxx11::string::c_str();
        anon_unknown.dwarf_1c4133::writeReadRGBA
                  ((char *)tempDir,in_stack_0000010c,in_stack_00000108,_W,H,in_stack_000000f8,
                   in_stack_00000120);
        std::__cxx11::string::~string(local_a8);
        std::operator+(in_stack_ffffffffffffff18,
                       (char *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
        std::__cxx11::string::c_str();
        anon_unknown.dwarf_1c4133::writeReadRGBA
                  ((char *)tempDir,in_stack_0000010c,in_stack_00000108,_W,H,in_stack_000000f8,
                   in_stack_00000120);
        std::__cxx11::string::~string((string *)&stack0xffffffffffffff38);
      }
    }
    anon_unknown.dwarf_1c4133::writeReadIncomplete(in_stack_000001a0);
  }
  anon_unknown.dwarf_1c4133::writeReadLayers(in_stack_000006f0);
  poVar2 = std::operator<<((ostream *)&std::cout,"ok\n");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  Imf_2_5::Array2D<Imf_2_5::Rgba>::~Array2D(in_stack_fffffffffffffef0);
  return;
}

Assistant:

void
testRgba (const std::string &tempDir)
{
    try
    {
	cout << "Testing the RGBA image interface" << endl;

	rgbaMethods ();

	const int W = 237;
	const int H = 119;

	Array2D<Rgba> p1 (H, W);
	fillPixels (p1, W, H);

	int maxThreads = ILMTHREAD_NAMESPACE::supportsThreads()? 3: 0;

	for (int n = 0; n <= maxThreads; ++n)
	{
	    if (ILMTHREAD_NAMESPACE::supportsThreads())
	    {
		setGlobalThreadCount (n);
		cout << "\nnumber of threads: " << globalThreadCount() << endl;
	    }

	    for (int lorder = 0; lorder < RANDOM_Y; ++lorder)
	    {
		for (int comp = 0; comp < NUM_COMPRESSION_METHODS; ++comp)
		{
		    writeReadRGBA ((tempDir + "imf_test_rgba.exr").c_str(),
				   W, H, p1,
				   WRITE_RGBA,
				   LineOrder (lorder),
				   Compression (comp));

		    writeReadRGBA ((tempDir + "imf_test_rgba.exr").c_str(),
				   W, H, p1,
				   WRITE_RGB,
				   LineOrder (lorder),
				   Compression (comp));

		    writeReadRGBA ((tempDir + "imf_test_rgba.exr").c_str(),
				   W, H, p1,
				   WRITE_A,
				   LineOrder (lorder),
				   Compression (comp));

		    writeReadRGBA ((tempDir + "imf_test_rgba.exr").c_str(),
				   W, H, p1,
				   RgbaChannels (WRITE_R | WRITE_B),
				   LineOrder (lorder),
				   Compression (comp));
		}
	    }

	    writeReadIncomplete (tempDir);
	}

	writeReadLayers (tempDir);

	cout << "ok\n" << endl;
    }
    catch (const std::exception &e)
    {
	cerr << "ERROR -- caught exception: " << e.what() << endl;
	assert (false);
    }
}